

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QSize __thiscall QDockWidgetLayout::minimumSize(QDockWidgetLayout *this)

{
  QLayoutItem *pQVar1;
  long lVar2;
  Representation extraout_var;
  QSize QVar3;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  lVar2 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  local_20.wd.m_i = 0;
  local_20.ht.m_i = 0;
  pQVar1 = *(this->item_list).d.ptr;
  if (pQVar1 != (QLayoutItem *)0x0) {
    local_20.wd.m_i = (*pQVar1->_vptr_QLayoutItem[3])();
    local_20.ht.m_i = extraout_var.m_i;
  }
  QVar3 = sizeFromContent(this,&local_20,
                          (bool)((byte)*(undefined4 *)(*(long *)(lVar2 + 0x20) + 0xc) & 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetLayout::minimumSize() const
{
    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());

    QSize content(0, 0);
    if (item_list[Content] != 0)
        content = item_list[Content]->minimumSize();

    return sizeFromContent(content, w->isFloating());
}